

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O2

void __thiscall xray_re::se_smart_terrain::state_write(se_smart_terrain *this,xr_packet *packet)

{
  ushort uVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  allocator<char> local_41;
  string local_40 [32];
  
  cse_alife_smart_zone::state_write((cse_alife_smart_zone *)this,packet);
  uVar1 = *(ushort *)&this->field_0x28;
  if (0x7f < uVar1) {
    if (uVar1 == 0x80) {
      cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,false,"se_smart_terrain");
      (*packet->_vptr_xr_packet[10])(packet,(ulong)this->arriving_npc_count);
      (*packet->_vptr_xr_packet[10])(packet,(ulong)this->npc_info_count);
      (*packet->_vptr_xr_packet[10])(packet,(ulong)this->dead_time_count);
      (*packet->_vptr_xr_packet[10])(packet,(ulong)this->base_on_actor_control_present);
      (*packet->_vptr_xr_packet[10])(packet,(ulong)this->is_respawn_point);
      (*packet->_vptr_xr_packet[10])(packet,(ulong)this->population);
      cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,true,"se_smart_terrain");
      return;
    }
    __assert_fail("m_version <= CSE_VERSION_COP",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0x20f,"virtual void xray_re::se_smart_terrain::state_write(xr_packet &)");
  }
  if (uVar1 < 0x7a) {
    if (uVar1 == 0x65) {
      (*packet->_vptr_xr_packet[10])(packet,0);
      (*packet->_vptr_xr_packet[10])(packet,0);
      (*packet->_vptr_xr_packet[10])(packet,0);
      UNRECOVERED_JUMPTABLE = packet->_vptr_xr_packet[10];
    }
    else {
      if (uVar1 != 0x76) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x242,"virtual void xray_re::se_smart_terrain::state_write(xr_packet &)");
      }
      (*packet->_vptr_xr_packet[10])(packet,0);
      (*packet->_vptr_xr_packet[10])(packet,0);
      UNRECOVERED_JUMPTABLE = packet->_vptr_xr_packet[0xc];
    }
    (*UNRECOVERED_JUMPTABLE)(packet,0);
    return;
  }
  if (uVar1 < 0x7d) {
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,false,"se_smart_terrain");
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,false,"CCombat_manager");
    (*packet->_vptr_xr_packet[0xc])(packet,0);
    std::__cxx11::string::string<std::allocator<char>>(local_40,"nil",&local_41);
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    std::__cxx11::string::~string(local_40);
    (*packet->_vptr_xr_packet[8])(packet,0xffff);
    std::__cxx11::string::string<std::allocator<char>>(local_40,"nil",&local_41);
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    std::__cxx11::string::~string(local_40);
    (*packet->_vptr_xr_packet[0xc])(packet,0);
    (*packet->_vptr_xr_packet[10])(packet,0);
    (*packet->_vptr_xr_packet[0xc])(packet,0);
    (*packet->_vptr_xr_packet[10])(packet,0);
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,false,"CCover_manager");
    (*packet->_vptr_xr_packet[0xc])(packet,0);
    (*packet->_vptr_xr_packet[10])(packet,0);
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,true,"CCover_manager");
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,true,"CCombat_manager");
    (*packet->_vptr_xr_packet[10])(packet,0);
    (*packet->_vptr_xr_packet[10])(packet,0);
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,true,"se_smart_terrain");
    return;
  }
  __assert_fail("m_version <= CSE_VERSION_CS",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                ,0x21d,"virtual void xray_re::se_smart_terrain::state_write(xr_packet &)");
}

Assistant:

void se_smart_terrain::state_write(xr_packet& packet)
{
	cse_alife_smart_zone::state_write(packet);
	if (m_version >= CSE_VERSION_0x80) {
		xr_assert(m_version <= CSE_VERSION_COP);

		set_save_marker(packet, SM_SAVE, false, "se_smart_terrain");
	
	    packet.w_u8(arriving_npc_count);
	    packet.w_u8(npc_info_count);
	    packet.w_u8(dead_time_count);
	    packet.w_u8(base_on_actor_control_present);
	    packet.w_u8(is_respawn_point);
	    packet.w_u8(population);
	  
	  set_save_marker(packet, SM_SAVE, true, "se_smart_terrain");
	}
	else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);

		set_save_marker(packet, SM_SAVE, false, "se_smart_terrain");

		// CCombat_manager
		set_save_marker(packet, SM_SAVE, false, "CCombat_manager");
		packet.w_bool(false);
		packet.w_sz("nil");
		packet.w_u16(0xffff);
		packet.w_sz("nil");
		packet.w_bool(false);
		packet.w_u8(0);
		packet.w_bool(false);
		packet.w_u8(0);

		// CCover_manager
		set_save_marker(packet, SM_SAVE, false, "CCover_manager");
		packet.w_bool(false);
		packet.w_u8(0);
		set_save_marker(packet, SM_SAVE, true, "CCover_manager");
		set_save_marker(packet, SM_SAVE, true, "CCombat_manager");

		// actual se_smart_terrain
		packet.w_u8(0);
		packet.w_u8(0);

		set_save_marker(packet, SM_SAVE, true, "se_smart_terrain");
	} else if (m_version == CSE_VERSION_SOC) {
		w_ctime(packet);
		w_ctime(packet);
		packet.w_bool(false);
	} else if (m_version == CSE_VERSION_2215) {
		packet.w_u8(0);
		w_ctime(packet);
		w_ctime(packet);
		packet.w_u8(0);
	} else {
		xr_not_implemented();
	}
}